

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

bool __thiscall
duckdb::BlockIndexManager::RemoveIndex(BlockIndexManager *this,idx_t index,TemporaryBufferSize size)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  iterator __position;
  long lVar3;
  InternalException *this_00;
  ulong new_index;
  allocator local_59;
  idx_t index_local;
  unsigned_long max_entry;
  
  index_local = index;
  __position = ::std::
               _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               ::find(&(this->indexes_in_use)._M_t,&index_local);
  p_Var1 = &(this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node == p_Var1) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&max_entry,"RemoveIndex - index %llu not found in indexes_in_use",&local_59
              );
    InternalException::InternalException<unsigned_long>(this_00,(string *)&max_entry,index_local);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)&this->indexes_in_use,(const_iterator)__position._M_node);
  ::std::
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  ::_M_insert_unique<unsigned_long_const&>
            ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
              *)&this->free_indexes,&index_local);
  if ((this->indexes_in_use)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    new_index = 0;
  }
  else {
    lVar3 = ::std::_Rb_tree_decrement(&p_Var1->_M_header);
    new_index = *(long *)(lVar3 + 0x20) + 1;
  }
  uVar2 = this->max_index;
  if (new_index < uVar2) {
    SetMaxIndex(this,new_index,size);
    while ((this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      lVar3 = ::std::_Rb_tree_decrement
                        (&(this->free_indexes)._M_t._M_impl.super__Rb_tree_header._M_header);
      max_entry = *(ulong *)(lVar3 + 0x20);
      if (max_entry < this->max_index) break;
      ::std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::erase(&(this->free_indexes)._M_t,&max_entry);
    }
  }
  return new_index < uVar2;
}

Assistant:

bool BlockIndexManager::RemoveIndex(idx_t index, const TemporaryBufferSize size) {
	// remove this block from the set of blocks
	auto entry = indexes_in_use.find(index);
	if (entry == indexes_in_use.end()) {
		throw InternalException("RemoveIndex - index %llu not found in indexes_in_use", index);
	}
	indexes_in_use.erase(entry);
	free_indexes.insert(index);
	// check if we can truncate the file

	// get the max_index in use right now
	auto max_index_in_use = indexes_in_use.empty() ? 0 : *indexes_in_use.rbegin() + 1;
	if (max_index_in_use < max_index) {
		// max index in use is lower than the max_index
		// reduce the max_index
		SetMaxIndex(max_index_in_use, size);
		// we can remove any free_indexes that are larger than the current max_index
		while (HasFreeBlocks()) {
			auto max_entry = *free_indexes.rbegin();
			if (max_entry < max_index) {
				break;
			}
			free_indexes.erase(max_entry);
		}
		return true;
	}
	return false;
}